

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O2

PreservedAnalyses * __thiscall
GlobalToStack::run(PreservedAnalyses *__return_storage_ptr__,GlobalToStack *this,Module *M,
                  ModuleAnalysisManager *AM)

{
  bool bVar1;
  MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
  *this_00;
  pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_> *KV;
  Module *G;
  undefined8 *puVar2;
  Module *pMVar3;
  long lVar4;
  PreservedAnalyses *PA;
  SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U> Usage;
  GlobalVariable *local_218;
  Function *local_210;
  MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
  local_208;
  
  this_00 = &local_208;
  llvm::
  MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
  ::MapVector(this_00);
  for (pMVar3 = M + 0x10; pMVar3 = *(Module **)pMVar3, pMVar3 != M + 8; pMVar3 = pMVar3 + 8) {
    G = pMVar3 + -0x38;
    if (pMVar3 == (Module *)0x0) {
      G = (Module *)0x0;
    }
    bVar1 = shouldInline((GlobalToStack *)this_00,(GlobalVariable *)G);
    if (bVar1) {
      local_210 = getUsingFunction((Value *)G);
      this_00 = (MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                 *)llvm::
                   MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                   ::operator[](&local_208,&local_210);
      local_218 = (GlobalVariable *)G;
      llvm::
      SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
      ::insert((SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
                *)this_00,&local_218);
    }
  }
  puVar2 = (undefined8 *)
           local_208.Vector.
           super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
           .
           super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
           .
           super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
           .super_SmallVectorBase<unsigned_int>.BeginX;
  for (lVar4 = (ulong)local_208.Vector.
                      super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
                      .
                      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
                      .super_SmallVectorBase<unsigned_int>.Size * 0x60; lVar4 != 0;
      lVar4 = lVar4 + -0x60) {
    inlineGlobals(this,(Function *)*puVar2,
                  (SmallSetVector<llvm::GlobalVariable_*,_4U> *)(puVar2 + 1));
    puVar2 = puVar2 + 0xc;
  }
  if (local_208.Vector.
      super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
      .
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
      .
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
      .super_SmallVectorBase<unsigned_int>.Size == 0) {
    llvm::PreservedAnalyses::all();
  }
  else {
    llvm::PreservedAnalyses::PreservedAnalyses(__return_storage_ptr__);
    llvm::PreservedAnalyses::preserveSet<llvm::CFGAnalyses>(__return_storage_ptr__);
  }
  llvm::
  MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
  ::~MapVector(&local_208);
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses GlobalToStack::run(Module &M,
                                           ModuleAnalysisManager &AM) {

  SmallMapVector<Function *, SmallSetVector<GlobalVariable *, 4>, 4> Usage;

  for (GlobalVariable &G : M.globals())
    if (shouldInline(G))
      Usage[getUsingFunction(G)].insert(&G);

  for (auto &KV : Usage)
    inlineGlobals(KV.first, KV.second);

  if (Usage.empty()) {
    return llvm::PreservedAnalyses::all();
  }

  llvm::PreservedAnalyses PA;
  PA.preserveSet<CFGAnalyses>();
  return PA;
}